

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O2

void __thiscall slang::OS::printE(OS *this,text_style *style,string_view text)

{
  string_view text_00;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_20._M_str = (char *)text._M_len;
  local_20._M_len = (size_t)style;
  if (capturingOutput) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&capturedStderr_abi_cxx11_,&local_20);
  }
  else {
    if (!showColorsStderr) {
      text_00.size_ = (size_t)&stderr;
      text_00.data_ = (char *)style;
      ::fmt::v9::detail::print((detail *)_stderr,(FILE *)local_20._M_str,text_00);
      return;
    }
    local_10._M_len = 2;
    local_10._M_str = "{}";
    ::fmt::v9::
    print<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_0>
              (_stderr,(text_style *)this,&local_10,&local_20);
  }
  return;
}

Assistant:

void OS::printE(const fmt::text_style& style, string_view text) {
    if (capturingOutput)
        capturedStderr += text;
    else if (showColorsStderr)
        fmt::print(stderr, style, "{}"sv, text);
    else
        fmt::detail::print(stderr, fmt::detail::to_string_view(text));
}